

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::current_path(error_code *ec)

{
  long lVar1;
  int *piVar2;
  pointer __buf;
  char *pcVar3;
  path *this;
  undefined8 *in_RSI;
  path *in_RDI;
  error_code eVar4;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  size_t pathlen;
  char *in_stack_ffffffffffffff88;
  error_code *in_stack_ffffffffffffff90;
  format fmt;
  path *source;
  undefined4 uStack_34;
  int local_20;
  int local_1c;
  size_t local_18;
  undefined8 *local_10;
  
  source = in_RDI;
  local_10 = in_RSI;
  std::error_code::clear(in_stack_ffffffffffffff90);
  fmt = (format)((ulong)in_RDI >> 0x20);
  lVar1 = pathconf(".",4);
  local_1c = (int)lVar1;
  local_20 = 0x1000;
  piVar2 = std::max<int>(&local_1c,&local_20);
  local_18 = (size_t)*piVar2;
  operator_new__(local_18 + 1);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  __buf = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                    ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_ffffffffffffff90);
  pcVar3 = getcwd(__buf,local_18);
  if (pcVar3 == (char *)0x0) {
    eVar4 = detail::make_system_error((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    in_stack_ffffffffffffff90 = (error_code *)eVar4._M_cat;
    *local_10 = CONCAT44(uStack_34,eVar4._M_value);
    local_10[1] = in_stack_ffffffffffffff90;
    path::path((path *)0x1318f5);
  }
  else {
    this = (path *)std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                             ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                              in_stack_ffffffffffffff90);
    path::path<char*,ghc::filesystem::path>(this,(char **)source,fmt);
  }
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_ffffffffffffff90);
  return source;
}

Assistant:

GHC_INLINE path current_path(std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    DWORD pathlen = ::GetCurrentDirectoryW(0, 0);
    std::unique_ptr<wchar_t[]> buffer(new wchar_t[size_t(pathlen) + 1]);
    if (::GetCurrentDirectoryW(pathlen, buffer.get()) == 0) {
        ec = detail::make_system_error();
        return path();
    }
    return path(std::wstring(buffer.get()), path::native_format);
#else
    size_t pathlen = static_cast<size_t>(std::max(int(::pathconf(".", _PC_PATH_MAX)), int(PATH_MAX)));
    std::unique_ptr<char[]> buffer(new char[pathlen + 1]);
    if (::getcwd(buffer.get(), pathlen) == nullptr) {
        ec = detail::make_system_error();
        return path();
    }
    return path(buffer.get());
#endif
}